

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O3

void llama_perf_context_print(llama_context *ctx)

{
  long lVar1;
  llama_perf_context_data data;
  llama_perf_context_data local_48;
  
  llama_perf_context(&local_48,ctx);
  lVar1 = ggml_time_us();
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s:        load time = %10.2f ms\n",local_48.t_load_ms,
                     "llama_perf_context_print");
  llama_log_internal(GGML_LOG_LEVEL_INFO,
                     "%s: prompt eval time = %10.2f ms / %5d tokens (%8.2f ms per token, %8.2f tokens per second)\n"
                     ,local_48.t_p_eval_ms,local_48.t_p_eval_ms / (double)local_48.n_p_eval,
                     (1000.0 / local_48.t_p_eval_ms) * (double)local_48.n_p_eval,
                     "llama_perf_context_print",(ulong)(uint)local_48.n_p_eval);
  llama_log_internal(GGML_LOG_LEVEL_INFO,
                     "%s:        eval time = %10.2f ms / %5d runs   (%8.2f ms per token, %8.2f tokens per second)\n"
                     ,local_48.t_eval_ms,local_48.t_eval_ms / (double)local_48.n_eval,
                     (1000.0 / local_48.t_eval_ms) * (double)local_48.n_eval,
                     "llama_perf_context_print",(ulong)(uint)local_48.n_eval);
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s:       total time = %10.2f ms / %5d tokens\n",
                     (double)lVar1 * 0.001 - local_48.t_start_ms,"llama_perf_context_print",
                     (ulong)(uint)(local_48.n_eval + local_48.n_p_eval));
  return;
}

Assistant:

void llama_perf_context_print(const llama_context * ctx) {
    const auto data = llama_perf_context(ctx);

    const double t_end_ms = 1e-3 * ggml_time_us();

    LLAMA_LOG_INFO("%s:        load time = %10.2f ms\n", __func__, data.t_load_ms);
    LLAMA_LOG_INFO("%s: prompt eval time = %10.2f ms / %5d tokens (%8.2f ms per token, %8.2f tokens per second)\n",
            __func__, data.t_p_eval_ms, data.n_p_eval, data.t_p_eval_ms / data.n_p_eval, 1e3 / data.t_p_eval_ms * data.n_p_eval);
    LLAMA_LOG_INFO("%s:        eval time = %10.2f ms / %5d runs   (%8.2f ms per token, %8.2f tokens per second)\n",
            __func__, data.t_eval_ms, data.n_eval, data.t_eval_ms / data.n_eval, 1e3 / data.t_eval_ms * data.n_eval);
    LLAMA_LOG_INFO("%s:       total time = %10.2f ms / %5d tokens\n", __func__, (t_end_ms - data.t_start_ms), (data.n_p_eval + data.n_eval));
}